

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O3

void test_dt_base64Binary(void)

{
  char cVar1;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  wchar16 *pwVar6;
  char *pcVar7;
  long lVar8;
  void *pvVar9;
  char *pcVar10;
  bool bVar11;
  Status myStatus;
  char lex_iv_1 [8];
  Status myStatus_8;
  char lex_iv_2 [12];
  char lex_v_2 [10];
  char lex_v_2_canrep [9];
  char lex_v_1_canrep [13];
  char lex_v_1 [21];
  StrX local_140;
  undefined8 local_130;
  char local_128 [12];
  Status local_11c;
  char local_118 [16];
  char local_108 [16];
  char local_f8 [16];
  char local_e8 [16];
  char local_d8 [24];
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 local_b0;
  undefined8 *puStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 *puStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  builtin_strncpy(local_d8,"  134x cv56 gui0   \n",0x15);
  builtin_strncpy(local_108,"wxtz 8e4k",10);
  builtin_strncpy(local_118,"134xcv56gui",0xc);
  builtin_strncpy(local_128,"wxtz8e4",8);
  local_b8 = (undefined8 *)operator_new__(9);
  *local_b8 = 0xe8827afe72317ed7;
  *(undefined1 *)(local_b8 + 1) = 0xb4;
  local_c0 = (undefined8 *)operator_new__(9);
  *local_c0 = 0x24eef1731bc3;
  *(undefined1 *)(local_c0 + 1) = 0;
  builtin_strncpy(local_e8 + 8,"gui0",5);
  builtin_strncpy(local_e8,"134xcv56",8);
  builtin_strncpy(local_f8,"wxtz8e4k",9);
  local_130 = (char *)((ulong)local_130._4_4_ << 0x20);
  local_140.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_140.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_140.fUnicodeForm,dt_base64Binary,(Status *)&local_130,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_140);
  if (cVar2 == '\0') {
    StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xda7,local_d8,local_140.fLocalForm,1);
    StrX::~StrX(&local_140);
    errSeen = 1;
  }
  local_130 = (char *)((ulong)local_130 & 0xffffffff00000000);
  local_140.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_140.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_140.fUnicodeForm,dt_base64Binary,(Status *)&local_130,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_140);
  if (cVar2 == '\0') {
    StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xda8,local_108,local_140.fLocalForm,1);
    StrX::~StrX(&local_140);
    errSeen = 1;
  }
  local_130 = (char *)((ulong)local_130 & 0xffffffff00000000);
  local_140.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_140.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_140.fUnicodeForm,dt_base64Binary,(Status *)&local_130,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_140);
  if (cVar2 == '\0') {
    if ((Status)local_130 != st_FOCA0002) {
      StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      if (((ulong)local_130 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_130 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xdab,local_128,local_140.fLocalForm,"st_FOCA0002",pcVar10);
      goto LAB_0011f51c;
    }
  }
  else {
    StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xdab,local_128,local_140.fLocalForm,0);
LAB_0011f51c:
    StrX::~StrX(&local_140);
    errSeen = 1;
  }
  local_130 = (char *)((ulong)local_130 & 0xffffffff00000000);
  local_140.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_140.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_140.fUnicodeForm,dt_base64Binary,(Status *)&local_130,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_140);
  if (cVar2 == '\0') {
    if ((Status)local_130 == st_FOCA0002) goto LAB_0011f62e;
    StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    if (((ulong)local_130 & 0xffffffff) < 0xb) {
      pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_130 & 0xffffffff];
    }
    else {
      pcVar10 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xdac,local_118,local_140.fLocalForm,"st_FOCA0002",pcVar10);
  }
  else {
    StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xdac,local_118,local_140.fLocalForm,0);
  }
  StrX::~StrX(&local_140);
  errSeen = 1;
LAB_0011f62e:
  bVar11 = true;
  do {
    local_130 = (char *)((ulong)local_130 & 0xffffffff00000000);
    local_140.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_140.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar9 = (void *)0xf;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_140.fUnicodeForm,dt_base64Binary,(Status *)&local_130,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_140);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdc6,local_d8);
      StrX::~StrX(&local_140);
      errSeen = 1;
    }
    else {
      puStack_80 = local_b8;
      local_68 = local_38;
      local_78 = local_48;
      uStack_70 = uStack_40;
      expValue.fValue.f_long = (int64_t)local_b8;
      expValue._0_8_ = local_88;
      expValue.fValue._8_8_ = local_48;
      expValue.fValue._16_8_ = uStack_40;
      expValue.fValue.f_datetime.f_milisec = (double)local_38;
      bVar3 = compareActualValue(dt_base64Binary,*pXVar4,expValue);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    local_130 = (char *)((ulong)local_130 & 0xffffffff00000000);
    local_140.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_140.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar9 = (void *)0xf;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_140.fUnicodeForm,dt_base64Binary,(Status *)&local_130,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_140);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdc7,local_108);
      StrX::~StrX(&local_140);
      errSeen = 1;
    }
    else {
      puStack_a8 = local_c0;
      local_90 = local_50;
      local_a0 = local_60;
      uStack_98 = uStack_58;
      expValue_00.fValue.f_long = (int64_t)local_c0;
      expValue_00._0_8_ = local_b0;
      expValue_00.fValue._8_8_ = local_60;
      expValue_00.fValue._16_8_ = uStack_58;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_50;
      bVar3 = compareActualValue(dt_base64Binary,*pXVar4,expValue_00);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    local_130 = (char *)((ulong)local_130 & 0xffffffff00000000);
    local_140.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_140.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_140.fUnicodeForm,dt_base64Binary,(Status *)&local_130,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_140);
    if (pXVar5 == (XSValue *)0x0) {
      if ((Status)local_130 != st_FOCA0002) {
        StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_130 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_130 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xdca,local_128,local_140.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_140);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      pvVar9 = (void *)0xdca;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdca,local_128);
      StrX::~StrX(&local_140);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    local_130 = (char *)((ulong)local_130 & 0xffffffff00000000);
    local_140.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_140.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_140.fUnicodeForm,dt_base64Binary,(Status *)&local_130,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_140);
    if (pXVar5 == (XSValue *)0x0) {
      if ((Status)local_130 != st_FOCA0002) {
        StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_130 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_130 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xdcb,local_118,local_140.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_140);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      pvVar9 = (void *)0xdcb;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdcb,local_118);
      StrX::~StrX(&local_140);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    bVar3 = bVar11 != false;
    bVar11 = false;
  } while (bVar3);
  bVar11 = true;
  do {
    local_11c = st_Init;
    local_140.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_140.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_140.fUnicodeForm,dt_base64Binary,&local_11c,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_140);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xde7,local_d8);
      StrX::~StrX(&local_140);
      errSeen = 1;
    }
    else {
      local_130 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_e8;
      if (local_130 != pcVar10) {
        pcVar7 = local_130;
        if (local_130 == (char *)0x0) {
LAB_0011fbc5:
          if (*pcVar10 == '\0') goto LAB_0011fc15;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0011fbc5;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xde7,local_d8,local_140.fLocalForm,local_130,local_e8);
        StrX::~StrX(&local_140);
        errSeen = 1;
      }
LAB_0011fc15:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release
                ((char **)&local_130,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_11c = st_Init;
    local_140.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_140.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_108,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_140.fUnicodeForm,dt_base64Binary,&local_11c,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_140);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xde8,local_108);
      StrX::~StrX(&local_140);
      errSeen = 1;
    }
    else {
      local_130 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_f8;
      if (local_130 != pcVar10) {
        pcVar7 = local_130;
        if (local_130 == (char *)0x0) {
LAB_0011fd08:
          if (*pcVar10 == '\0') goto LAB_0011fd58;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0011fd08;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xde8,local_108,local_140.fLocalForm,local_130,local_f8);
        StrX::~StrX(&local_140);
        errSeen = 1;
      }
LAB_0011fd58:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release
                ((char **)&local_130,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_130 = (char *)((ulong)local_130 & 0xffffffff00000000);
    local_140.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_140.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_140.fUnicodeForm,dt_base64Binary,(Status *)&local_130,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_140);
    if (lVar8 == 0) {
      if ((Status)local_130 != st_FOCA0002) {
        StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_130 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_130 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xdeb,local_128,local_140.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_140);
        goto LAB_0011fe6a;
      }
    }
    else {
      StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdeb,local_128);
      StrX::~StrX(&local_140);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0011fe6a:
      errSeen = 1;
    }
    local_130 = (char *)((ulong)local_130 & 0xffffffff00000000);
    local_140.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_140.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_140.fUnicodeForm,dt_base64Binary,(Status *)&local_130,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_140);
    if (lVar8 == 0) {
      if ((Status)local_130 != st_FOCA0002) {
        StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_130 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_130 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xdec,local_118,local_140.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_140);
        goto LAB_0011ff73;
      }
    }
    else {
      StrX::StrX(&local_140,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdec,local_118);
      StrX::~StrX(&local_140);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_0011ff73:
      errSeen = 1;
    }
    bVar3 = bVar11 == false;
    bVar11 = false;
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_base64Binary()
{
    const XSValue::DataType dt = XSValue::dt_base64Binary;
    bool  toValidate = true;

    const char lex_v_1[]="  134x cv56 gui0   \n";
    const char lex_v_2[]="wxtz 8e4k";

    const char lex_iv_2[]="134xcv56gui";
    const char lex_iv_1[]="wxtz8e4";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    //actual values:
    //"134x cv56 gui0"  :     D7 7E 31 72 FE 7A 82 E8 B4
    //"wxtz 8e4k"       :     C3 1B 73 F1 EE 24
    act_v_ran_v_1.fValue.f_byteVal = new XMLByte[9];
    act_v_ran_v_1.fValue.f_byteVal[0] = 0xd7;
    act_v_ran_v_1.fValue.f_byteVal[1] = 0x7e;
    act_v_ran_v_1.fValue.f_byteVal[2] = 0x31;
    act_v_ran_v_1.fValue.f_byteVal[3] = 0x72;
    act_v_ran_v_1.fValue.f_byteVal[4] = 0xfe;
    act_v_ran_v_1.fValue.f_byteVal[5] = 0x7a;
    act_v_ran_v_1.fValue.f_byteVal[6] = 0x82;
    act_v_ran_v_1.fValue.f_byteVal[7] = 0xe8;
    act_v_ran_v_1.fValue.f_byteVal[8] = 0xb4;
    act_v_ran_v_2.fValue.f_byteVal = new XMLByte[9];
    act_v_ran_v_2.fValue.f_byteVal[0] = 0xc3;
    act_v_ran_v_2.fValue.f_byteVal[1] = 0x1b;
    act_v_ran_v_2.fValue.f_byteVal[2] = 0x73;
    act_v_ran_v_2.fValue.f_byteVal[3] = 0xf1;
    act_v_ran_v_2.fValue.f_byteVal[4] = 0xee;
    act_v_ran_v_2.fValue.f_byteVal[5] = 0x24;
    act_v_ran_v_2.fValue.f_byteVal[6] = 0;
    act_v_ran_v_2.fValue.f_byteVal[7] = 0;
    act_v_ran_v_2.fValue.f_byteVal[8] = 0;

    const char lex_v_1_canrep[]="134xcv56gui0";
    const char lex_v_2_canrep[]="wxtz8e4k";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid                                  true              n/a
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid
    VALIDATE_TEST(lex_v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(lex_v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid                                    XSValue         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid                                    XSValue         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        // lexical valid
        ACTVALUE_TEST(lex_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);

        // lexical invalid
        ACTVALUE_TEST(lex_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(lex_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *  lexical valid                                    XMLCh            n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid                                    XMLCh            n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        // lexical valid
        CANREP_TEST(lex_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE, lex_v_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE, lex_v_2_canrep, DONT_CARE);

        // lexical invalid
        CANREP_TEST(lex_iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,   XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,   XSValue::st_FOCA0002);
    }

}